

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaCom.c
# Opt level: O0

int Abc_CommandMerge(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Pla_Man_t *p_00;
  char *pcVar3;
  int fVerbose;
  int fMulti;
  int c;
  Pla_Man_t *p;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p_00 = Pla_AbcGetMan(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    do {
      iVar2 = Extra_UtilGetopt(argc,argv,"mvh");
      if (iVar2 == -1) {
        if (p_00 == (Pla_Man_t *)0x0) {
          Abc_Print(1,"Abc_CommandMerge(): There is no current design.\n");
        }
        else {
          Pla_ManDist1Merge(p_00);
        }
        return 0;
      }
      if (iVar2 == 0x68) goto LAB_004a2ff2;
    } while (iVar2 == 0x6d);
    if (iVar2 != 0x76) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
LAB_004a2ff2:
  Abc_Print(-2,"usage: |merge [-mvh]\n");
  Abc_Print(-2,"\t         performs distance-1 merge using cube hashing\n");
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandMerge( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Pla_Man_t * p = Pla_AbcGetMan(pAbc);
    int c, fMulti = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "mvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'm':
            fMulti ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Abc_CommandMerge(): There is no current design.\n" );
        return 0;
    }
    // transform
    Pla_ManDist1Merge( p );
    return 0;
usage:
    Abc_Print( -2, "usage: |merge [-mvh]\n" );
    Abc_Print( -2, "\t         performs distance-1 merge using cube hashing\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}